

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_detect.c
# Opt level: O0

_Bool compute_corner_list(YV12_BUFFER_CONFIG *frame,int bit_depth,int downsample_level,
                         CornerList *corners)

{
  int iVar1;
  xy *__ptr;
  long lVar2;
  byte bVar3;
  long in_RCX;
  int i_2;
  int copied_corners;
  int bucket;
  int found_corners;
  int threshold;
  int i_1;
  int histogram [256];
  int i;
  xy *frame_corners_xy;
  int num_corners;
  int *scores;
  int stride;
  int height;
  int width;
  uint8_t *buf;
  int layers;
  ImagePyramid *pyr;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  int in_stack_fffffffffffffb88;
  int iVar4;
  int in_stack_fffffffffffffb8c;
  undefined4 in_stack_fffffffffffffb90;
  int iVar5;
  undefined4 in_stack_fffffffffffffb94;
  int in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  int in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba4;
  byte *in_stack_fffffffffffffba8;
  int *in_stack_fffffffffffffbc0;
  int local_64;
  int local_54;
  _Bool local_1;
  
  iVar1 = aom_compute_pyramid((YV12_BUFFER_CONFIG *)
                              CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                              in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88,
                              (ImagePyramid *)
                              CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  if (iVar1 < 0) {
    local_1 = false;
  }
  else {
    bVar3 = (char)iVar1 - 1;
    __ptr = aom_fast9_detect_nonmax
                      (in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,in_stack_fffffffffffffba0
                       ,in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98,
                       (int **)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                       in_stack_fffffffffffffbc0);
    if (local_54 < 0) {
      local_1 = false;
    }
    else {
      if (local_54 < 0x1001) {
        for (local_64 = 0; local_64 < local_54; local_64 = local_64 + 1) {
          *(int *)(in_RCX + 0x30 + (long)(local_64 << 1) * 4) =
               __ptr[local_64].x * (1 << (bVar3 & 0x1f));
          *(int *)(in_RCX + 0x30 + (long)(local_64 * 2 + 1) * 4) =
               __ptr[local_64].y * (1 << (bVar3 & 0x1f));
        }
        *(int *)(in_RCX + 0x2c) = local_54;
      }
      else {
        memset(&stack0xfffffffffffffb98,0,0x400);
        for (iVar1 = 0; iVar1 < local_54; iVar1 = iVar1 + 1) {
          *(int *)(&stack0xfffffffffffffb98 + (long)*(int *)((long)iVar1 * 4) * 4) =
               *(int *)(&stack0xfffffffffffffb98 + (long)*(int *)((long)iVar1 * 4) * 4) + 1;
        }
        iVar4 = 0xff;
        for (iVar1 = 0;
            (iVar5 = -1, -1 < iVar4 &&
            (iVar5 = iVar4, iVar1 + *(int *)(&stack0xfffffffffffffb98 + (long)iVar4 * 4) < 0x1001));
            iVar1 = *(int *)(&stack0xfffffffffffffb98 + lVar2 * 4) + iVar1) {
          lVar2 = (long)iVar4;
          iVar4 = iVar4 + -1;
        }
        iVar1 = 0;
        for (iVar4 = 0; iVar4 < local_54; iVar4 = iVar4 + 1) {
          if (iVar5 < *(int *)((long)iVar4 * 4)) {
            *(int *)(in_RCX + 0x30 + (long)(iVar1 << 1) * 4) =
                 __ptr[iVar4].x * (1 << (bVar3 & 0x1f));
            *(int *)(in_RCX + 0x30 + (long)(iVar1 * 2 + 1) * 4) =
                 __ptr[iVar4].y * (1 << (bVar3 & 0x1f));
            iVar1 = iVar1 + 1;
          }
        }
        *(int *)(in_RCX + 0x2c) = iVar1;
      }
      free((void *)0x0);
      free(__ptr);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static bool compute_corner_list(const YV12_BUFFER_CONFIG *frame, int bit_depth,
                                int downsample_level, CornerList *corners) {
  ImagePyramid *pyr = frame->y_pyramid;
  const int layers =
      aom_compute_pyramid(frame, bit_depth, downsample_level + 1, pyr);

  if (layers < 0) {
    return false;
  }

  // Clamp downsampling ratio base on max number of layers allowed
  // for this frame size
  downsample_level = layers - 1;

  const uint8_t *buf = pyr->layers[downsample_level].buffer;
  int width = pyr->layers[downsample_level].width;
  int height = pyr->layers[downsample_level].height;
  int stride = pyr->layers[downsample_level].stride;

  int *scores = NULL;
  int num_corners;
  xy *const frame_corners_xy = aom_fast9_detect_nonmax(
      buf, width, height, stride, FAST_BARRIER, &scores, &num_corners);
  if (num_corners < 0) return false;

  if (num_corners <= MAX_CORNERS) {
    // Use all detected corners
    for (int i = 0; i < num_corners; i++) {
      corners->corners[2 * i + 0] =
          frame_corners_xy[i].x * (1 << downsample_level);
      corners->corners[2 * i + 1] =
          frame_corners_xy[i].y * (1 << downsample_level);
    }
    corners->num_corners = num_corners;
  } else {
    // There are more than MAX_CORNERS corners avilable, so pick out a subset
    // of the sharpest corners, as these will be the most useful for flow
    // estimation
    int histogram[256];
    av1_zero(histogram);
    for (int i = 0; i < num_corners; i++) {
      assert(FAST_BARRIER <= scores[i] && scores[i] <= 255);
      histogram[scores[i]] += 1;
    }

    int threshold = -1;
    int found_corners = 0;
    for (int bucket = 255; bucket >= 0; bucket--) {
      if (found_corners + histogram[bucket] > MAX_CORNERS) {
        // Set threshold here
        threshold = bucket;
        break;
      }
      found_corners += histogram[bucket];
    }
    assert(threshold != -1 && "Failed to select a valid threshold");

    int copied_corners = 0;
    for (int i = 0; i < num_corners; i++) {
      if (scores[i] > threshold) {
        assert(copied_corners < MAX_CORNERS);
        corners->corners[2 * copied_corners + 0] =
            frame_corners_xy[i].x * (1 << downsample_level);
        corners->corners[2 * copied_corners + 1] =
            frame_corners_xy[i].y * (1 << downsample_level);
        copied_corners += 1;
      }
    }
    assert(copied_corners == found_corners);
    corners->num_corners = copied_corners;
  }

  free(scores);
  free(frame_corners_xy);
  return true;
}